

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport.c
# Opt level: O2

void wait_worker_thread(TRANSPORT_HANDLE_DATA *transportData)

{
  THREADAPI_RESULT TVar1;
  LOGGER_LOG p_Var2;
  int res;
  
  if (transportData->workerThreadHandle != (THREAD_HANDLE)0x0) {
    TVar1 = ThreadAPI_Join(transportData->workerThreadHandle,&res);
    if (TVar1 == THREADAPI_OK) {
      transportData->workerThreadHandle = (THREAD_HANDLE)0x0;
    }
    else {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport.c"
                  ,"wait_worker_thread",0x117,1,"ThreadAPI_Join failed");
      }
    }
  }
  return;
}

Assistant:

static void wait_worker_thread(TRANSPORT_HANDLE_DATA * transportData)
{
    if (transportData->workerThreadHandle != NULL)
    {
        int res;
        if (ThreadAPI_Join(transportData->workerThreadHandle, &res) != THREADAPI_OK)
        {
            LogError("ThreadAPI_Join failed");
        }
        else
        {
            transportData->workerThreadHandle = NULL;
        }
    }
}